

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# False.hpp
# Opt level: O0

FalseOperand * __thiscall
ut11::Operands::FalseOperand::GetErrorMessage<bool>(FalseOperand *this,bool *actual)

{
  ostream *poVar1;
  bool *in_RDX;
  utility local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream errorMessage;
  ostream local_198 [376];
  bool *local_20;
  bool *actual_local;
  FalseOperand *this_local;
  
  local_20 = in_RDX;
  actual_local = actual;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"Expected false but was ");
  utility::ToString<bool>(local_1d8,local_20);
  std::operator<<(poVar1,(string *)local_1d8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

inline std::string GetErrorMessage(const T& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected false but was " << utility::ToString(actual);
				return errorMessage.str();
			}